

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder *pDecoder,ma_uint64 *pLength)

{
  long *plVar1;
  ma_result mVar2;
  ma_uint32 sampleRateIn;
  ma_uint64 internalLengthInPCMFrames;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 local_30;
  ma_uint32 local_24;
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  
  mVar2 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) &&
     (*pLength = 0, mVar2 = MA_INVALID_ARGS, pDecoder != (ma_decoder *)0x0)) {
    plVar1 = (long *)pDecoder->pBackend;
    if (plVar1 == (long *)0x0) {
      mVar2 = MA_NO_BACKEND;
    }
    else {
      local_30 = 0;
      if (plVar1[2] == -1) {
        if (*(code **)(*plVar1 + 0x20) == (code *)0x0) {
          mVar2 = MA_NOT_IMPLEMENTED;
        }
        else {
          mVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,&local_30);
        }
      }
      else {
        local_30 = plVar1[2] - plVar1[1];
        mVar2 = MA_SUCCESS;
      }
      if (mVar2 == MA_SUCCESS) {
        plVar1 = (long *)pDecoder->pBackend;
        sampleRateIn = 0;
        if (plVar1 == (long *)0x0) {
          mVar2 = MA_INVALID_ARGS;
        }
        else if (*(code **)(*plVar1 + 0x10) == (code *)0x0) {
          mVar2 = MA_NOT_IMPLEMENTED;
        }
        else {
          mVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,local_1c,local_20,&local_24,0,0);
          sampleRateIn = 0;
          if (mVar2 == MA_SUCCESS) {
            sampleRateIn = local_24;
          }
        }
        if (mVar2 == MA_SUCCESS) {
          if (sampleRateIn != pDecoder->outputSampleRate) {
            local_30 = ma_calculate_frame_count_after_resampling
                                 (pDecoder->outputSampleRate,sampleRateIn,local_30);
          }
          *pLength = local_30;
          mVar2 = MA_SUCCESS;
        }
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder* pDecoder, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalLengthInPCMFrames;
        ma_uint32 internalSampleRate;

        result = ma_data_source_get_length_in_pcm_frames(pDecoder->pBackend, &internalLengthInPCMFrames);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal length. */
        }

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;   /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            *pLength = internalLengthInPCMFrames;
        } else {
            *pLength = ma_calculate_frame_count_after_resampling(pDecoder->outputSampleRate, internalSampleRate, internalLengthInPCMFrames);
        }

        return MA_SUCCESS;
    } else {
        return MA_NO_BACKEND;
    }
}